

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O0

void reg_reset(uc_struct_conflict15 *uc)

{
  void *__s;
  CPUTriCoreState *env;
  uc_struct_conflict15 *uc_local;
  
  __s = uc->cpu->env_ptr;
  memset(__s,0,0x40);
  memset((void *)((long)__s + 0x40),0,0x40);
  *(undefined4 *)((long)__s + 0x9c) = 0;
  return;
}

Assistant:

static void reg_reset(struct uc_struct *uc)
{
    CPUArchState *env = uc->cpu->env_ptr;

    memset(env->gregs, 0, sizeof(env->gregs));
    memset(env->fpr, 0, sizeof(env->fpr));
    memset(env->regbase, 0, sizeof(env->regbase));

    env->pc = 0;
    env->npc = 0;
    env->regwptr = env->regbase;
}